

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O2

void __thiscall
CVmObjIterLookupTable::load_from_image
          (CVmObjIterLookupTable *this,vm_obj_id_t self,char *ptr,size_t siz)

{
  ushort *puVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t sVar3;
  
  if ((this->super_CVmObjIter).super_CVmObject.ext_ != (char *)0x0) {
    (*G_mem_X->varheap_->_vptr_CVmVarHeap[6])();
    (this->super_CVmObjIter).super_CVmObject.ext_ = (char *)0x0;
  }
  sVar3 = 9;
  if (9 < siz) {
    sVar3 = siz;
  }
  iVar2 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])(G_mem_X->varheap_,sVar3,this);
  (this->super_CVmObjIter).super_CVmObject.ext_ = (char *)CONCAT44(extraout_var,iVar2);
  memcpy((char *)CONCAT44(extraout_var,iVar2),ptr,siz);
  CVmObjTable::save_image_pointer(&G_obj_table_X,self,ptr,siz);
  puVar1 = (ushort *)((this->super_CVmObjIter).super_CVmObject.ext_ + 7);
  *puVar1 = *puVar1 & 0xfffe;
  return;
}

Assistant:

void CVmObjIterLookupTable::load_from_image(VMG_ vm_obj_id_t self,
                                            const char *ptr, size_t siz)
{
    /* if we already have memory allocated, free it */
    if (ext_ != 0)
    {
        G_mem->get_var_heap()->free_mem(ext_);
        ext_ = 0;
    }

    /* 
     *   Allocate a new extension.  Make sure it's at least as large as the
     *   current standard extension size.  
     */
    ext_ = (char *)G_mem->get_var_heap()
           ->alloc_mem(siz < VMOBJITERLOOKUPTABLE_EXT_SIZE
                       ? VMOBJITERLOOKUPTABLE_EXT_SIZE : siz, this);

    /* copy the image data to our extension */
    memcpy(ext_, ptr, siz);

    /* 
     *   save our image data pointer in the object table, so that we can
     *   access it (without storing it ourselves) during a reload 
     */
    G_obj_table->save_image_pointer(self, ptr, siz);

    /* clear the undo flag */
    set_flags(get_flags() & ~VMOBJITERLOOKUPTABLE_UNDO);
}